

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O0

SleepUnit duckdb::SleepCommand::ParseUnit(string *unit)

{
  bool bVar1;
  runtime_error *this;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (((bVar1) ||
      (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), bVar1)) ||
     (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), bVar1)) {
    return SECOND;
  }
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (((!bVar1) &&
      (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), !bVar1)) &&
     (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), !bVar1)) {
    bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (((!bVar1) &&
        (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), !bVar1)) &&
       (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), !bVar1)) {
      bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (((!bVar1) &&
          (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), !bVar1)) &&
         (bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), !bVar1)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,
                   "Unrecognized sleep mode - expected second/millisecond/microescond/nanosecond");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      return NANOSECOND;
    }
    return MICROSECOND;
  }
  return MILLISECOND;
}

Assistant:

SleepUnit SleepCommand::ParseUnit(const string &unit) {
	if (unit == "second" || unit == "seconds" || unit == "sec") {
		return SleepUnit::SECOND;
	} else if (unit == "millisecond" || unit == "milliseconds" || unit == "milli") {
		return SleepUnit::MILLISECOND;
	} else if (unit == "microsecond" || unit == "microseconds" || unit == "micro") {
		return SleepUnit::MICROSECOND;
	} else if (unit == "nanosecond" || unit == "nanoseconds" || unit == "nano") {
		return SleepUnit::NANOSECOND;
	} else {
		throw std::runtime_error("Unrecognized sleep mode - expected second/millisecond/microescond/nanosecond");
	}
}